

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParserTestCase.cpp
# Opt level: O0

char * SuiteHttpParserTests::UnitTestSuite::GetSuiteName(void)

{
  return "HttpParserTests";
}

Assistant:

SUITE(HttpParserTests)
{

struct readHttpMessageFixture
{
  readHttpMessageFixture()
  {
    httpMsg1 = "GET / HTTP/1.0\r\nContent Type: text/html\r\n\r\n";
    httpMsg2 = "GET /a HTTP/1.0\r\nContent Type: text/html\r\n\r\n";
    httpMsg3 = "GET /a HTTP/1.0\r\nContent Type: text/html\r\n\r\n";

    object.addToStream( httpMsg1 + httpMsg2 + httpMsg3 );
  }

  std::string httpMsg1;
  std::string httpMsg2;
  std::string httpMsg3;
  HttpParser object;
};

TEST_FIXTURE(readHttpMessageFixture, readHttpMessage)
{
  std::string readHttpMsg;
  CHECK( object.readHttpMessage( readHttpMsg ) );
  CHECK_EQUAL( httpMsg1, readHttpMsg );

  CHECK( object.readHttpMessage( readHttpMsg ) );
  CHECK_EQUAL( httpMsg2, readHttpMsg );

  CHECK( object.readHttpMessage( readHttpMsg ) );
  CHECK_EQUAL( httpMsg3, readHttpMsg );
}

struct readPartialHttpMessageFixture
{
  readPartialHttpMessageFixture()
  {
    partHttpMsg1 = "GET / HTTP/1.0\r\nContent ";
    partHttpMsg2 = "Type: text/html\r\n\r\n";
    object.addToStream( partHttpMsg1 );
  }

  std::string partHttpMsg1;
  std::string partHttpMsg2;
  HttpParser object;
};

TEST_FIXTURE(readPartialHttpMessageFixture, readPartialHttpMessage)
{
  std::string readPartHttpMsg;
  CHECK( !object.readHttpMessage( readPartHttpMsg ) );
  object.addToStream( partHttpMsg2 );
  CHECK( object.readHttpMessage( readPartHttpMsg ) );
  CHECK_EQUAL( ( partHttpMsg1 + partHttpMsg2 ), readPartHttpMsg );
}

}